

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButtonPrivate::onButtonPressed(QToolButtonPrivate *this)

{
  ToolButtonPopupMode TVar1;
  int msec;
  QObject *obj;
  bool bVar2;
  
  obj = *(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  bVar2 = hasMenu(this);
  if ((bVar2) && (TVar1 = this->popupMode, TVar1 != MenuButtonPopup)) {
    msec = this->delay;
    if (TVar1 == DelayedPopup && 0 < msec) {
      QBasicTimer::start(&this->popupTimer,msec,obj);
      return;
    }
    if (TVar1 == InstantPopup || msec == 0) {
      QToolButton::showMenu((QToolButton *)obj);
      return;
    }
  }
  return;
}

Assistant:

void QToolButtonPrivate::onButtonPressed()
{
    Q_Q(QToolButton);
    if (!hasMenu())
        return; // no menu to show
    if (popupMode == QToolButton::MenuButtonPopup)
        return;
    else if (delay > 0 && popupMode == QToolButton::DelayedPopup)
        popupTimer.start(delay, q);
    else if (delay == 0 || popupMode == QToolButton::InstantPopup)
        q->showMenu();
}